

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::D3MFExporter::writeMetaData(D3MFExporter *this)

{
  ostringstream *poVar1;
  aiMetadata *paVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  char *local_470;
  string k;
  aiString value;
  
  paVar2 = this->mScene->mMetaData;
  if ((paVar2 != (aiMetadata *)0x0) && (uVar3 = (ulong)paVar2->mNumProperties, uVar3 != 0)) {
    poVar1 = &this->mModelOutput;
    lVar6 = 0;
    local_470 = (char *)0x0;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      paVar2 = this->mScene->mMetaData;
      if (uVar5 < paVar2->mNumProperties) {
        local_470 = paVar2->mKeys->data + lVar6 + -4;
      }
      std::__cxx11::string::string((string *)&k,local_470 + 4,(allocator *)&value);
      value.length = 0;
      value.data[0] = '\0';
      memset(value.data + 1,0x1b,0x3ff);
      aiMetadata::Get<aiString>(this->mScene->mMetaData,&k,&value);
      poVar4 = std::operator<<((ostream *)poVar1,"<");
      poVar4 = std::operator<<(poVar4,(string *)XmlTag::meta_abi_cxx11_);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,(string *)XmlTag::meta_name_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"=\"");
      poVar4 = std::operator<<(poVar4,local_470 + 4);
      std::operator<<(poVar4,"\">");
      std::operator<<((ostream *)poVar1,value.data);
      poVar4 = std::operator<<((ostream *)poVar1,"</");
      poVar4 = std::operator<<(poVar4,(string *)XmlTag::meta_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,">");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&k);
      lVar6 = lVar6 + 0x404;
    }
  }
  return;
}

Assistant:

void D3MFExporter::writeMetaData() {
    if ( nullptr == mScene->mMetaData ) {
        return;
    }

    const unsigned int numMetaEntries( mScene->mMetaData->mNumProperties );
    if ( 0 == numMetaEntries ) {
        return;
    }

	const aiString *key = nullptr;
    const aiMetadataEntry *entry(nullptr);
    for ( size_t i = 0; i < numMetaEntries; ++i ) {
        mScene->mMetaData->Get( i, key, entry );
        std::string k( key->C_Str() );
        aiString value;
        mScene->mMetaData->Get(  k, value );
        mModelOutput << "<" << XmlTag::meta << " " << XmlTag::meta_name << "=\"" << key->C_Str() << "\">";
        mModelOutput << value.C_Str();
        mModelOutput << "</" << XmlTag::meta << ">" << std::endl;
    }
}